

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O3

TValue * cpwriter(lua_State *L,lua_CFunction dummy,void *ud)

{
  byte bVar1;
  uint uVar2;
  undefined4 uVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint8_t zero;
  undefined1 local_19;
  
  pvVar4 = lj_mem_realloc(L,*ud,*(MSize *)((long)ud + 0xc),0x400);
  *(void **)ud = pvVar4;
  *(undefined4 *)((long)ud + 0xc) = 0x400;
  uVar10 = (ulong)*(uint *)(*(long *)((long)ud + 0x18) + 0x28);
  uVar2 = *(uint *)(uVar10 + 0xc);
  *(undefined4 *)((long)ud + 8) = 0;
  if (uVar2 + 10 < 0x401) {
    uVar7 = 0;
  }
  else {
    bcwrite_resize((BCWriteCtx *)ud,uVar2 + 10);
    uVar7 = *(uint *)((long)ud + 8);
    pvVar4 = *ud;
  }
  *(uint *)((long)ud + 8) = uVar7 + 1;
  *(undefined1 *)((long)pvVar4 + (ulong)uVar7) = 0x1b;
  uVar7 = *(uint *)((long)ud + 8);
  *(uint *)((long)ud + 8) = uVar7 + 1;
  *(undefined1 *)(*ud + (ulong)uVar7) = 0x4c;
  uVar7 = *(uint *)((long)ud + 8);
  *(uint *)((long)ud + 8) = uVar7 + 1;
  *(undefined1 *)(*ud + (ulong)uVar7) = 0x4a;
  uVar7 = *(uint *)((long)ud + 8);
  *(uint *)((long)ud + 8) = uVar7 + 1;
  *(undefined1 *)(*ud + (ulong)uVar7) = 1;
  bVar1 = *(byte *)(*(long *)((long)ud + 0x18) + 0x25);
  uVar7 = *(uint *)((long)ud + 8);
  *(uint *)((long)ud + 8) = uVar7 + 1;
  *(byte *)(*ud + (ulong)uVar7) = bVar1 & 4 | (*(int *)((long)ud + 0x30) != 0) * '\x02';
  lVar9 = *ud;
  uVar7 = *(uint *)((long)ud + 8);
  uVar6 = (ulong)uVar7;
  if (*(int *)((long)ud + 0x30) == 0) {
    uVar8 = (ulong)uVar2;
    if (uVar2 < 0x80) {
      uVar8 = (ulong)uVar2;
      uVar5 = uVar6;
    }
    else {
      do {
        uVar7 = (uint)uVar8;
        uVar5 = (ulong)((int)uVar6 + 1);
        *(byte *)(lVar9 + uVar6) = (byte)uVar8 | 0x80;
        uVar8 = uVar8 >> 7;
        uVar6 = uVar5;
      } while (0x3fff < uVar7);
    }
    *(char *)(lVar9 + uVar5) = (char)uVar8;
    lVar9 = *ud;
    uVar7 = (int)uVar5 + uVar2 + 1;
    *(uint *)((long)ud + 8) = uVar7;
    if (uVar2 != 0) {
      uVar6 = 0;
      do {
        *(undefined1 *)(lVar9 + (ulong)((int)uVar5 + 1) + uVar6) =
             *(undefined1 *)(uVar10 + 0x10 + uVar6);
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
      lVar9 = *ud;
      uVar7 = *(uint *)((long)ud + 8);
    }
  }
  uVar3 = (**(code **)((long)ud + 0x20))
                    (*(undefined8 *)((long)ud + 0x10),lVar9,uVar7,*(undefined8 *)((long)ud + 0x28));
  *(undefined4 *)((long)ud + 0x34) = uVar3;
  bcwrite_proto((BCWriteCtx *)ud,*(GCproto **)((long)ud + 0x18));
  if (*(int *)((long)ud + 0x34) == 0) {
    local_19 = 0;
    uVar3 = (**(code **)((long)ud + 0x20))
                      (*(undefined8 *)((long)ud + 0x10),&local_19,1,*(undefined8 *)((long)ud + 0x28)
                      );
    *(undefined4 *)((long)ud + 0x34) = uVar3;
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cpwriter(lua_State *L, lua_CFunction dummy, void *ud)
{
  BCWriteCtx *ctx = (BCWriteCtx *)ud;
  UNUSED(dummy);
  lj_str_resizebuf(L, &ctx->sb, 1024);  /* Avoids resize for most prototypes. */
  bcwrite_header(ctx);
  bcwrite_proto(ctx, ctx->pt);
  bcwrite_footer(ctx);
  return NULL;
}